

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Ses_ManCleanLight(Ses_Man_t *pSes)

{
  int *piVar1;
  word *pwVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)pSes->nSpecFunc;
  if (pSes->nSpecFunc < 1) {
    uVar4 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    if (((uint)pSes->bSpecInv >> ((uint)uVar6 & 0x1f) & 1) != 0) {
      pwVar2 = pSes->pSpec;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        pwVar2[(int)uVar5 + lVar7] = ~pwVar2[(int)uVar5 + lVar7];
      }
    }
    uVar5 = (ulong)((int)uVar5 + 4);
  }
  piVar3 = pSes->pArrTimeProfile;
  if (piVar3 != (int *)0x0) {
    for (lVar7 = 0; lVar7 < pSes->nSpecVars; lVar7 = lVar7 + 1) {
      piVar1 = piVar3 + lVar7;
      *piVar1 = *piVar1 + pSes->nArrTimeDelta;
    }
  }
  Vec_IntFree(pSes->vPolar);
  Vec_IntFree(pSes->vAssump);
  Vec_IntFree(pSes->vStairDecVars);
  free(pSes);
  return;
}

Assistant:

static inline void Ses_ManCleanLight( Ses_Man_t * pSes )
{
    int h, i;
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        if ( ( pSes->bSpecInv >> h ) & 1 )
            for ( i = 0; i < 4; ++i )
                pSes->pSpec[(h << 2) + i] = ~( pSes->pSpec[(h << 2) + i] );

    if ( pSes->pArrTimeProfile )
        for ( i = 0; i < pSes->nSpecVars; ++i )
            pSes->pArrTimeProfile[i] += pSes->nArrTimeDelta;

    Vec_IntFree( pSes->vPolar );
    Vec_IntFree( pSes->vAssump );
    Vec_IntFree( pSes->vStairDecVars );

    ABC_FREE( pSes );
}